

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

bool __thiscall
mpt::content<mpt::reference<mpt::metatype>_*>::set_length
          (content<mpt::reference<mpt::metatype>_*> *this,long len)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  
  uVar4 = len * 8;
  uVar1 = (this->super_buffer)._used;
  bVar3 = true;
  if (uVar1 != uVar4) {
    if (uVar4 < uVar1) {
      bVar3 = (bool)mpt::buffer::trim((ulong)this);
      return bVar3;
    }
    lVar2 = mpt::buffer::insert((ulong)this,uVar4);
    bVar3 = lVar2 != 0;
  }
  return bVar3;
}

Assistant:

bool set_length(long len)
	{
		size_t set = len * sizeof(T);
		if (set == _used) {
			return true;
		}
		if (set < _used) {
			return buffer::trim(_used - set);
		}
		/* data before offset gets initialized */
		uint8_t *ptr = static_cast<uint8_t *>(buffer::insert(set, 0));
		return ptr ? true : false;
	}